

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

Value * __thiscall GlobOptBlockData::SetValue(GlobOptBlockData *this,Value *val,Opnd *opnd)

{
  OpndKind OVar1;
  SymOpnd *pSVar2;
  RegOpnd *pRVar3;
  StackSym *local_28;
  Sym *sym;
  Opnd *opnd_local;
  Value *val_local;
  GlobOptBlockData *this_local;
  
  if (opnd != (Opnd *)0x0) {
    OVar1 = IR::Opnd::GetKind(opnd);
    if (OVar1 == OpndKindSym) {
      pSVar2 = IR::Opnd::AsSymOpnd(opnd);
      local_28 = (StackSym *)pSVar2->m_sym;
    }
    else if (OVar1 == OpndKindReg) {
      pRVar3 = IR::Opnd::AsRegOpnd(opnd);
      local_28 = pRVar3->m_sym;
    }
    else {
      local_28 = (StackSym *)0x0;
    }
    if (local_28 != (StackSym *)0x0) {
      SetValue(this,val,&local_28->super_Sym);
    }
  }
  return val;
}

Assistant:

Value *
GlobOptBlockData::SetValue(Value *val, IR::Opnd *opnd)
{
    if (opnd)
    {
        Sym *sym;
        switch (opnd->GetKind())
        {
        case IR::OpndKindSym:
            sym = opnd->AsSymOpnd()->m_sym;
            break;

        case IR::OpndKindReg:
            sym = opnd->AsRegOpnd()->m_sym;
            break;

        default:
            sym = nullptr;
        }
        if (sym)
        {
            this->SetValue(val, sym);
        }
    }

    return val;
}